

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Track::ParseContentEncodingsEntry(Track *this,longlong start,longlong size)

{
  long lVar1;
  ContentEncoding **ppCVar2;
  ContentEncoding *this_00;
  long stop;
  long unaff_R12;
  uint uVar3;
  bool bVar4;
  longlong pos;
  longlong size_1;
  longlong id;
  long local_60;
  long local_58;
  Track *local_50;
  IMkvReader *local_48;
  long local_40;
  longlong local_38;
  
  local_48 = this->m_pSegment->m_pReader;
  local_50 = this;
  if (local_48 == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x133f,"long mkvparser::Track::ParseContentEncodingsEntry(long long, long long)")
    ;
  }
  stop = size + start;
  uVar3 = 0;
  local_60 = start;
  local_38 = start;
  while (local_60 < stop) {
    lVar1 = ParseElementHeader(local_48,&local_60,stop,&local_40,&local_58);
    if (lVar1 < 0) {
      bVar4 = false;
      unaff_R12 = lVar1;
    }
    else {
      uVar3 = uVar3 + (local_40 == 0x6240);
      local_60 = local_60 + local_58;
      bVar4 = local_60 <= stop;
      if (stop < local_60) {
        unaff_R12 = -2;
      }
    }
    if (!bVar4) {
      return unaff_R12;
    }
  }
  if ((int)uVar3 < 1) {
    return -1;
  }
  ppCVar2 = (ContentEncoding **)operator_new__((ulong)uVar3 << 3,(nothrow_t *)&std::nothrow);
  local_50->content_encoding_entries_ = ppCVar2;
  if (ppCVar2 == (ContentEncoding **)0x0) {
    return -1;
  }
  local_50->content_encoding_entries_end_ = ppCVar2;
  local_60 = local_38;
  do {
    if (stop <= local_60) {
      return (ulong)(local_60 == stop) * 2 + -2;
    }
    lVar1 = ParseElementHeader(local_48,&local_60,stop,&local_40,&local_58);
    if (lVar1 < 0) {
      bVar4 = false;
    }
    else {
      lVar1 = unaff_R12;
      if (local_40 == 0x6240) {
        this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
        if (this_00 == (ContentEncoding *)0x0) {
          this_00 = (ContentEncoding *)0x0;
        }
        else {
          this_00->encryption_entries_ = (ContentEncryption **)0x0;
          this_00->encryption_entries_end_ = (ContentEncryption **)0x0;
          this_00->compression_entries_ = (ContentCompression **)0x0;
          this_00->compression_entries_end_ = (ContentCompression **)0x0;
          this_00->encoding_order_ = 0;
          this_00->encoding_scope_ = 1;
          this_00->encoding_type_ = 0;
        }
        if (this_00 == (ContentEncoding *)0x0) {
          bVar4 = false;
          unaff_R12 = -1;
        }
        else {
          lVar1 = ContentEncoding::ParseContentEncodingEntry(this_00,local_60,local_58,local_48);
          bVar4 = lVar1 == 0;
          if (bVar4) {
            ppCVar2 = local_50->content_encoding_entries_end_;
            local_50->content_encoding_entries_end_ = ppCVar2 + 1;
            *ppCVar2 = this_00;
          }
          else {
            ContentEncoding::~ContentEncoding(this_00);
            operator_delete(this_00);
            unaff_R12 = lVar1;
          }
        }
        lVar1 = unaff_R12;
        if (!bVar4) {
          bVar4 = false;
          goto LAB_00118380;
        }
      }
      local_60 = local_60 + local_58;
      bVar4 = local_60 <= stop;
      if (stop < local_60) {
        lVar1 = -2;
      }
    }
LAB_00118380:
    unaff_R12 = lVar1;
    if (!bVar4) {
      return lVar1;
    }
  } while( true );
}

Assistant:

long Track::ParseContentEncodingsEntry(long long start, long long size) {
  IMkvReader* const pReader = m_pSegment->m_pReader;
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentEncoding elements.
  int count = 0;
  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding)
      ++count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (count <= 0)
    return -1;

  content_encoding_entries_ = new (std::nothrow) ContentEncoding*[count];
  if (!content_encoding_entries_)
    return -1;

  content_encoding_entries_end_ = content_encoding_entries_;

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ContentEncoding* const content_encoding =
          new (std::nothrow) ContentEncoding();
      if (!content_encoding)
        return -1;

      status = content_encoding->ParseContentEncodingEntry(pos, size, pReader);
      if (status) {
        delete content_encoding;
        return status;
      }

      *content_encoding_entries_end_++ = content_encoding;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}